

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int __thiscall CNumber<30>::shortest(CNumber<30> *this,type *right)

{
  int iVar1;
  
  if (this->m_number < right->m_number) {
    iVar1 = shortest_helper(this,right);
    return iVar1;
  }
  iVar1 = shortest_helper(right,this);
  return -iVar1;
}

Assistant:

int shortest(const type& right) const
        {
            // 1, 20 mod 30
            // 20 - 1 = 19
            // 1 - 20 = -19 mod 30 = 11
            if (*this < right)
            {
                return shortest_helper(right);
            }
            return -right.shortest_helper(*this);
        }